

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O1

QHostInfo qt_qhostinfo_lookup(QString *name,QObject *receiver,char *member,bool *valid,int *id)

{
  int iVar1;
  Type *name_00;
  int *in_R9;
  
  *(undefined1 *)id = 0;
  *in_R9 = -1;
  name_00 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
            ::operator()((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::(anonymous_namespace)::Q_QAS_theHostInfoLookupManager>_>
                          *)name);
  if ((name_00 != (Type *)0x0) && (((name_00->cache).enabled._M_base._M_i & 1U) != 0)) {
    (name->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QHostInfoCache::get((QHostInfoCache *)name,(QString *)name_00,(bool *)receiver);
    if ((char)*id != '\0') {
      return (QHostInfo)(QHostInfoPrivate *)name;
    }
    QHostInfo::~QHostInfo((QHostInfo *)name);
  }
  iVar1 = QHostInfo::lookupHostImpl
                    ((QString *)receiver,(QObject *)member,(QSlotObjectBase *)0x0,valid);
  *in_R9 = iVar1;
  QHostInfo::QHostInfo((QHostInfo *)name,-1);
  return (QHostInfo)(QHostInfoPrivate *)name;
}

Assistant:

QHostInfo qt_qhostinfo_lookup(const QString &name, QObject *receiver, const char *member, bool *valid, int *id)
{
    *valid = false;
    *id = -1;

    // check cache
    QHostInfoLookupManager* manager = theHostInfoLookupManager();
    if (manager && manager->cache.isEnabled()) {
        QHostInfo info = manager->cache.get(name, valid);
        if (*valid) {
            return info;
        }
    }

    // was not in cache, trigger lookup
    *id = QHostInfo::lookupHostImpl(name, receiver, nullptr, member);

    // return empty response, valid==false
    return QHostInfo();
}